

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

void ON_Viewport::GetPerspectiveClippingPlaneConstraints
               (ON_3dPoint camera_location,uint depth_buffer_bit_depth,double *min_near_dist,
               double *min_near_over_far)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  bVar1 = ON_3dPoint::IsValid(&camera_location);
  uVar2 = depth_buffer_bit_depth;
  if (bVar1) {
    dVar3 = ON_3dPoint::MaximumCoordinate(&camera_location);
    uVar2 = depth_buffer_bit_depth - 8;
    if (dVar3 <= 1000000.0) {
      uVar2 = depth_buffer_bit_depth;
    }
    if (depth_buffer_bit_depth < 0x10) {
      uVar2 = depth_buffer_bit_depth;
    }
  }
  dVar3 = *(double *)(&DAT_006e2880 + (ulong)(0xf < uVar2) * 8);
  dVar4 = dVar3;
  if (0x17 < uVar2) {
    dVar4 = 0.0005;
  }
  if (min_near_dist != (double *)0x0) {
    if (0x17 < uVar2) {
      dVar3 = 0.005;
    }
    *min_near_dist = dVar3;
  }
  if (min_near_over_far != (double *)0x0) {
    *min_near_over_far = dVar4;
  }
  return;
}

Assistant:

void ON_Viewport::GetPerspectiveClippingPlaneConstraints( 
  ON_3dPoint camera_location,
  unsigned int depth_buffer_bit_depth,
  double* min_near_dist,
  double* min_near_over_far
  )
{
  double nof, n, d;

  if ( camera_location.IsValid() )
  {
    /*

    // This code was used prior to 14 July 2011.
    //
    d = camera_location.DistanceTo(ON_3dPoint::Origin);
    if ( d >= 1.0e5 )
    {
      if ( depth_buffer_bit_depth >= 32 )
        depth_buffer_bit_depth -= 24;
      else
        depth_buffer_bit_depth = 8;
    }
    else if ( d >= 1.0e4 )
    {
      if ( depth_buffer_bit_depth >= 24 )
        depth_buffer_bit_depth -= 16;
      else
        depth_buffer_bit_depth = 8;
    }
    else if ( d >= 1.0e3 )
    {
      if ( depth_buffer_bit_depth >= 16 )
        depth_buffer_bit_depth -= 8;
      else
        depth_buffer_bit_depth = 8;
    }
    */

    // 14 July 2011 - Dale Lear
    //   The reductions above were too harsh and were
    //   generating clipping artifacts in the perspective
    //   view in bug report 88216.  Changing to
    //   to the code below gets rid of those
    //   artifacts at the risk of having a meaningless
    //   view to clip transform if the transformation is
    //   calculated with single precision numbers.
    //   If these values require further tuning, please
    //   discuss changes with me and attach example files
    //   to bug report 88216.
    d = camera_location.MaximumCoordinate();
    if ( d > 1.0e6 && depth_buffer_bit_depth >= 16 )
      depth_buffer_bit_depth -= 8;
  }

  if ( depth_buffer_bit_depth >= 32 )
  {
    nof = 0.0005; // Changed to match 24 bit defaults: https://mcneel.myjetbrains.com/youtrack/issue/RH-77623
    n = 0.005;    // Do not change back unless you've fixed the problems shown in the YT somewhere else.
  }
  else if ( depth_buffer_bit_depth >= 24 )
  {
    nof = 0.0005;
    n = 0.005;
  }
  else if ( depth_buffer_bit_depth >= 16 )
  {
    nof = 0.005;
    n = 0.005;
  }
  else
  {
    nof = 0.01;
    n = 0.01;
  }

  if ( min_near_dist )
    *min_near_dist = n;
  if ( min_near_over_far )
    *min_near_over_far = nof;
}